

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn_lex.cpp
# Opt level: O0

string * __thiscall util::Lexer::ReadOperator_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  allocator<char> local_1c;
  char local_1b;
  char local_1a [2];
  Lexer *pLStack_18;
  char chars [3];
  Lexer *this_local;
  
  pLStack_18 = this;
  memset(&local_1b,0,3);
  GetChar(this,&local_1b);
  PeekChar(this,local_1a);
  bVar1 = check_op(local_1b,local_1a[0]);
  if (bVar1) {
    GetChar(this,local_1a);
  }
  else {
    local_1a[0] = '\0';
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,&local_1b,&local_1c);
  std::allocator<char>::~allocator(&local_1c);
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::ReadOperator()
	{
		char chars[3]{};

		this->GetChar(chars[0]);
		this->PeekChar(chars[1]);

		if (check_op(chars[0], chars[1]))
			this->GetChar(chars[1]);
		else
			chars[1] = '\0';

		return chars;
	}